

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

void __thiscall QPDF::calculateHSharedObject(QPDF *this,NewObjTable *new_obj,ObjTable *obj)

{
  ulong uVar1;
  int iVar2;
  pointer pMVar3;
  reference pvVar4;
  size_t sVar5;
  int *piVar6;
  reference pvVar7;
  size_type sVar8;
  Object *pOVar9;
  NewObject *this_00;
  pointer pHVar10;
  allocator<char> local_b9;
  string local_b8;
  ulong local_98;
  size_t i_1;
  allocator<char> local_79;
  string local_78;
  int local_54;
  ulong uStack_50;
  int length;
  size_t i;
  int max_length;
  int min_length;
  vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *soe;
  HSharedObject *so;
  vector<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_> *csoe;
  CHSharedObject *cso;
  ObjTable *obj_local;
  NewObjTable *new_obj_local;
  QPDF *this_local;
  
  cso = (CHSharedObject *)obj;
  obj_local = (ObjTable *)new_obj;
  new_obj_local = (NewObjTable *)this;
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  csoe = (vector<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_> *)
         &pMVar3->c_shared_object_data;
  so = (HSharedObject *)&(pMVar3->c_shared_object_data).entries;
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  soe = (vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)
        &pMVar3->shared_object_hints;
  _max_length = &(pMVar3->shared_object_hints).entries;
  std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::clear
            (_max_length);
  pvVar4 = std::vector<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>::at
                     ((vector<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>
                       *)so,0);
  i._0_4_ = outputLengthNextN(this,pvVar4->object,1,(NewObjTable *)obj_local,(ObjTable *)cso);
  uStack_50 = 0;
  i._4_4_ = (int)i;
  while( true ) {
    uVar1 = uStack_50;
    sVar5 = toS<int>((int *)&(csoe->
                             super__Vector_base<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>
                             )._M_impl.super__Vector_impl_data._M_finish);
    if (sVar5 <= uVar1) break;
    pvVar4 = std::vector<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>::at
                       ((vector<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>
                         *)so,uStack_50);
    local_54 = outputLengthNextN(this,pvVar4->object,1,(NewObjTable *)obj_local,(ObjTable *)cso);
    piVar6 = std::min<int>((int *)((long)&i + 4),&local_54);
    i._4_4_ = *piVar6;
    piVar6 = std::max<int>((int *)&i,&local_54);
    i._0_4_ = *piVar6;
    std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::emplace_back<>
              (_max_length);
    iVar2 = local_54;
    pvVar7 = std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::at
                       (_max_length,uStack_50);
    pvVar7->delta_group_length = iVar2;
    uStack_50 = uStack_50 + 1;
  }
  sVar8 = std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::size
                    (_max_length);
  sVar5 = toS<int>((int *)&(csoe->
                           super__Vector_base<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
  if (sVar8 != sVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"soe has wrong size after initialization",&local_79);
    stopOnError(this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  *(undefined4 *)
   ((long)&(soe->
           super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>).
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
       *(undefined4 *)
        &(csoe->
         super__Vector_base<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>).
         _M_impl.super__Vector_impl_data._M_finish;
  *(undefined4 *)
   &(soe->super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
       *(undefined4 *)
        ((long)&(csoe->
                super__Vector_base<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>
                )._M_impl.super__Vector_impl_data._M_start + 4);
  if (*(int *)&(soe->
               super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
               )._M_impl.super__Vector_impl_data._M_end_of_storage <
      *(int *)((long)&(soe->
                      super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage + 4)) {
    pOVar9 = ObjTable<QPDFWriter::Object>::operator[]
                       ((ObjTable<QPDFWriter::Object> *)cso,
                        *(int *)&(csoe->
                                 super__Vector_base<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
    *(int *)&(soe->
             super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
             )._M_impl.super__Vector_impl_data._M_start = pOVar9->renumber;
    *(int *)((long)&soe[1].
                    super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start + 4) = i._4_4_;
    this_00 = ObjTable<QPDFWriter::NewObject>::operator[]
                        ((ObjTable<QPDFWriter::NewObject> *)obj_local,
                         *(int *)&(soe->
                                  super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                                  )._M_impl.super__Vector_impl_data._M_start);
    pHVar10 = (pointer)QPDFXRefEntry::getOffset(&this_00->xref);
    (soe->super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>).
    _M_impl.super__Vector_impl_data._M_finish = pHVar10;
  }
  *(int *)((long)&soe[1].
                  super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4) = i._4_4_;
  iVar2 = nbits((int)i - i._4_4_);
  *(int *)&soe[1].
           super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>.
           _M_impl.super__Vector_impl_data._M_finish = iVar2;
  local_98 = 0;
  while( true ) {
    uVar1 = local_98;
    sVar5 = toS<int>((int *)&(csoe->
                             super__Vector_base<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>
                             )._M_impl.super__Vector_impl_data._M_finish);
    if (sVar5 <= uVar1) break;
    pvVar7 = std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::at
                       (_max_length,local_98);
    if (pvVar7->delta_group_length < i._4_4_) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"found too small group length while writing linearization data"
                 ,&local_b9);
      stopOnError(this,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
    }
    iVar2 = i._4_4_;
    pvVar7 = std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::at
                       (_max_length,local_98);
    pvVar7->delta_group_length = pvVar7->delta_group_length - iVar2;
    local_98 = local_98 + 1;
  }
  return;
}

Assistant:

void
QPDF::calculateHSharedObject(
    QPDFWriter::NewObjTable const& new_obj, QPDFWriter::ObjTable const& obj)
{
    CHSharedObject& cso = m->c_shared_object_data;
    std::vector<CHSharedObjectEntry>& csoe = cso.entries;
    HSharedObject& so = m->shared_object_hints;
    std::vector<HSharedObjectEntry>& soe = so.entries;
    soe.clear();

    int min_length = outputLengthNextN(csoe.at(0).object, 1, new_obj, obj);
    int max_length = min_length;

    for (size_t i = 0; i < toS(cso.nshared_total); ++i) {
        // Assign absolute numbers to deltas; adjust later
        int length = outputLengthNextN(csoe.at(i).object, 1, new_obj, obj);
        min_length = std::min(min_length, length);
        max_length = std::max(max_length, length);
        soe.emplace_back();
        soe.at(i).delta_group_length = length;
    }
    if (soe.size() != toS(cso.nshared_total)) {
        stopOnError("soe has wrong size after initialization");
    }

    so.nshared_total = cso.nshared_total;
    so.nshared_first_page = cso.nshared_first_page;
    if (so.nshared_total > so.nshared_first_page) {
        so.first_shared_obj = obj[cso.first_shared_obj].renumber;
        so.min_group_length = min_length;
        so.first_shared_offset = new_obj[so.first_shared_obj].xref.getOffset();
    }
    so.min_group_length = min_length;
    so.nbits_delta_group_length = nbits(max_length - min_length);

    for (size_t i = 0; i < toS(cso.nshared_total); ++i) {
        // Adjust deltas
        if (soe.at(i).delta_group_length < min_length) {
            stopOnError("found too small group length while writing linearization data");
        }
        soe.at(i).delta_group_length -= min_length;
    }
}